

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
          (ConstraintExprVisitor *this,ReplicatedAssignmentPatternExpression *expr)

{
  not_null<const_slang::ast::Type_*> *this_00;
  int iVar1;
  Expression *this_01;
  long lVar2;
  bool bVar3;
  RandMode RVar4;
  ExpressionKind EVar5;
  SubroutineKind SVar6;
  Symbol *symbol;
  DistExpression *pDVar7;
  BinaryExpression *pBVar8;
  IntegerLiteral *pIVar9;
  CallExpression *this_02;
  Type *pTVar10;
  Diagnostic *diag;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar11;
  SourceLocation SVar12;
  long lVar13;
  DiagCode code;
  ASTContext *this_03;
  ArgList AVar15;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  SourceLocation SVar14;
  
  if (this->failed != false) {
    return false;
  }
  if (((this->isSoft == true) &&
      (symbol = Expression::getSymbolReference((Expression *)expr,true), symbol != (Symbol *)0x0))
     && (RVar4 = ASTContext::getRandMode(this->context,symbol), RVar4 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,
                        (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
  }
  EVar5 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if ((Call < EVar5) || ((0x340000U >> (EVar5 & OpenRange) & 1) == 0)) {
    ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::ConstraintExprVisitor&>(expr,this)
    ;
    EVar5 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  }
  switch(EVar5) {
  case IntegerLiteral:
    pIVar9 = Expression::as<slang::ast::IntegerLiteral>((Expression *)expr);
    SVInt::SVInt((SVInt *)&distVisitor,&pIVar9->valueStorage);
    goto LAB_0020a251;
  case RealLiteral:
  case TimeLiteral:
    this_03 = this->context;
    SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar12 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    Expression::as<slang::ast::UnbasedUnsizedIntegerLiteral>((Expression *)expr);
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&distVisitor);
LAB_0020a251:
    SVInt::~SVInt((SVInt *)&distVisitor);
    if (distVisitor._13_1_ != '\x01') {
      return true;
    }
    this_03 = this->context;
    SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar12 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_0020a158_caseD_23;
  case BinaryOp:
    pBVar8 = Expression::as<slang::ast::BinaryExpression>((Expression *)expr);
    if ((WildcardInequality < pBVar8->op) ||
       ((0x61800U >> (pBVar8->op & (LogicalShiftRight|BinaryXor)) & 1) == 0))
    goto switchD_0020a158_caseD_23;
switchD_0020a158_caseD_21:
    this_03 = this->context;
    SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar12 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    switch(EVar5) {
    case OpenRange:
      return true;
    case Dist:
      distVisitor.context = this->context;
      distVisitor.anyRandVars = false;
      pDVar7 = Expression::as<slang::ast::DistExpression>((Expression *)expr);
      this_01 = pDVar7->left_;
      Expression::visit<slang::ast::DistVarVisitor&>(this_01,&distVisitor);
      if (distVisitor.anyRandVars == false) {
        ASTContext::addDiag(this->context,(DiagCode)0x370008,this_01->sourceRange);
        return true;
      }
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_0020a158_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar5 == Call) {
        this_02 = Expression::as<slang::ast::CallExpression>((Expression *)expr);
        SVar6 = CallExpression::getSubroutineKind(this_02);
        if (SVar6 == Task) {
          this_03 = this->context;
          SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                   startLoc;
          SVar12 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc
          ;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_0020a208;
        }
        if (*(__index_type *)
             ((long)&(this_02->subroutine).
                     super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
             + 0x30) != '\x01') {
          ppSVar11 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               (&this_02->subroutine);
          AVar15 = SubroutineSymbol::getArguments(*ppSVar11);
          for (lVar13 = 0; AVar15.size_ * 8 != lVar13; lVar13 = lVar13 + 8) {
            lVar2 = *(long *)((long)AVar15.data_ + lVar13);
            iVar1 = *(int *)(lVar2 + 0x90);
            if (iVar1 == 3) {
              if ((*(byte *)(lVar2 + 0x8c) & 1) == 0) goto LAB_0020a33c;
            }
            else if (iVar1 == 1) {
LAB_0020a33c:
              this_03 = this->context;
              SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                       startLoc;
              SVar12 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                       endLoc;
              code.subsystem = Statements;
              code.code = 0x2d;
              goto LAB_0020a208;
            }
          }
        }
      }
      else if (EVar5 == Streaming) goto switchD_0020a158_caseD_21;
    }
    goto switchD_0020a158_caseD_23;
  }
LAB_0020a208:
  sourceRange.endLoc = SVar12;
  sourceRange.startLoc = SVar14;
  ASTContext::addDiag(this_03,code,sourceRange);
LAB_0020a20d:
  this->failed = true;
  return false;
switchD_0020a158_caseD_23:
  this_00 = &(expr->super_AssignmentPatternExpressionBase).super_Expression.type;
  pTVar10 = not_null<const_slang::ast::Type_*>::get(this_00);
  bVar3 = Type::isValidForRand(pTVar10,Rand);
  if (bVar3) {
    return true;
  }
  diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,
                             (expr->super_AssignmentPatternExpressionBase).super_Expression.
                             sourceRange);
  pTVar10 = not_null<const_slang::ast::Type_*>::get(this_00);
  ast::operator<<(diag,pTVar10);
  goto LAB_0020a20d;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }